

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

SharedPtr<vkt::Draw::Image> __thiscall
vkt::Draw::Image::copyToLinearImage
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,VkImageType type)

{
  int *piVar1;
  Allocation *pAVar2;
  Allocator *pAVar3;
  undefined8 obj;
  VkResult VVar4;
  undefined4 in_register_0000000c;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  SharedPtrStateBase *extraout_RDX_01;
  SharedPtrStateBase *extraout_RDX_02;
  SharedPtrStateBase *pSVar5;
  SharedPtr<vkt::Draw::Image> SVar6;
  VkExtent3D _extent;
  undefined4 in_stack_0000000c;
  VkImageType in_stack_00000040;
  VkCommandBuffer local_1c8;
  long *plStack_1c0;
  deUint32 local_1b8;
  undefined4 uStack_1b4;
  VkSemaphore *pVStack_1b0;
  Allocator *local_1a0;
  VkSubmitInfo submitInfo;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_140;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  CmdBufferBeginInfo beginInfo;
  ImageCreateInfo stagingResourceCreateInfo;
  VkImageType local_74;
  uint local_70;
  VkImageAspectFlagBits local_6c;
  undefined4 local_68;
  undefined8 local_64;
  int local_5c;
  VkImageType local_58;
  undefined8 local_54;
  undefined4 local_4c;
  undefined8 local_48;
  undefined4 local_40;
  deInt32 local_3c;
  int local_38;
  uint local_34;
  
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  *(undefined8 *)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = 0;
  _extent.height = depth;
  _extent.width = offset.z;
  _extent.depth = mipLevel;
  ImageCreateInfo::ImageCreateInfo
            (&stagingResourceCreateInfo,in_stack_00000040,*(VkFormat *)(queue + 0x30),_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_LINEAR,2,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  createAndAlloc((Image *)&submitInfo,*(DeviceInterface **)(queue + 0x60),
                 *(VkDevice *)(queue + 0x68),&stagingResourceCreateInfo.super_VkImageCreateInfo,
                 (Allocator *)CONCAT44(in_register_0000000c,layout),(MemoryRequirement)0x1);
  if (submitInfo.pNext != (void *)0x0) {
    (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)submitInfo._0_8_;
    *(void **)&(this->m_allocation).
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               field_0x8 = submitInfo.pNext;
    LOCK();
    *(int *)((long)submitInfo.pNext + 8) = *(int *)((long)submitInfo.pNext + 8) + 1;
    UNLOCK();
    LOCK();
    piVar1 = (int *)(*(long *)&(this->m_allocation).
                               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                               .m_data.field_0x8 + 0xc);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      piVar1 = (int *)((long)submitInfo.pNext + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        submitInfo._4_4_ = 0;
        (**(code **)(*submitInfo.pNext + 0x10))();
      }
      LOCK();
      piVar1 = (int *)((long)submitInfo.pNext + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) && (submitInfo.pNext != (void *)0x0)) {
        (**(code **)(*submitInfo.pNext + 8))();
      }
    }
  }
  CmdPoolCreateInfo::CmdPoolCreateInfo(&copyCmdPoolCreateInfo,0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,
             *(DeviceInterface **)(queue + 0x60),*(VkDevice *)(queue + 0x68),
             &copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo,(VkAllocationCallbacks *)0x0);
  obj = submitInfo._0_8_;
  DStack_140.m_device = (VkDevice)submitInfo._16_8_;
  DStack_140.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  DStack_140.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  local_1a0 = allocator;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,*(DeviceInterface **)(queue + 0x60),
             *(VkDevice *)(queue + 0x68),(VkCommandPool)submitInfo._0_8_,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_1b8 = submitInfo.waitSemaphoreCount;
  uStack_1b4 = submitInfo._20_4_;
  pVStack_1b0 = submitInfo.pWaitSemaphores;
  local_1c8 = (VkCommandBuffer)submitInfo._0_8_;
  plStack_1c0 = (long *)submitInfo.pNext;
  CmdBufferBeginInfo::CmdBufferBeginInfo(&beginInfo,0);
  VVar4 = (**(code **)(**(long **)(queue + 0x60) + 0x248))
                    (*(long **)(queue + 0x60),local_1c8,&beginInfo);
  ::vk::checkResult(VVar4,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x1b5);
  pAVar2 = (this->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  transition2DImage(*(DeviceInterface **)(queue + 0x60),local_1c8,(VkImage)pAVar2->m_offset,type,
                    VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,0,0);
  local_48 = 0;
  local_40 = 0;
  local_74 = type;
  local_70 = arrayElement;
  local_6c = aspect;
  local_68 = 1;
  local_64 = CONCAT44(in_stack_0000000c,width);
  local_5c = height;
  local_58 = type;
  local_54 = 0;
  local_4c = 1;
  local_38 = depth;
  local_34 = mipLevel;
  local_3c = offset.z;
  (**(code **)(**(long **)(queue + 0x60) + 0x300))
            (*(long **)(queue + 0x60),local_1c8,*(undefined8 *)(queue + 0x10),
             offset._0_8_ & 0xffffffff,pAVar2->m_offset,1,1,&local_74);
  VVar4 = (**(code **)(**(long **)(queue + 0x60) + 0x250))(*(long **)(queue + 0x60),local_1c8);
  ::vk::checkResult(VVar4,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x1bd);
  pAVar3 = local_1a0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = &local_1c8;
  (**(code **)(**(long **)(queue + 0x60) + 0x10))
            (*(long **)(queue + 0x60),local_1a0,1,&submitInfo,0);
  VVar4 = (**(code **)(**(long **)(queue + 0x60) + 0x18))(*(long **)(queue + 0x60),pAVar3);
  ::vk::checkResult(VVar4,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x1ce);
  pSVar5 = extraout_RDX;
  if (local_1c8 != (VkCommandBuffer)0x0) {
    submitInfo._0_8_ = local_1c8;
    (**(code **)(*plStack_1c0 + 0x240))(plStack_1c0,_local_1b8,pVStack_1b0,1);
    pSVar5 = extraout_RDX_00;
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_140,(VkCommandPool)obj);
    pSVar5 = extraout_RDX_01;
  }
  if (stagingResourceCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(stagingResourceCreateInfo.m_queueFamilyIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)stagingResourceCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)stagingResourceCreateInfo.m_queueFamilyIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pSVar5 = extraout_RDX_02;
  }
  SVar6.m_state = pSVar5;
  SVar6.m_ptr = this;
  return SVar6;
}

Assistant:

de::SharedPtr<Image> Image::copyToLinearImage (vk::VkQueue					queue,
											   vk::Allocator&				allocator,
											   vk::VkImageLayout			layout,
											   vk::VkOffset3D				offset,
											   int							width,
											   int							height,
											   int							depth,
											   unsigned int					mipLevel,
											   unsigned int					arrayElement,
											   vk::VkImageAspectFlagBits	aspect,
											   vk::VkImageType				type)
{
	de::SharedPtr<Image> stagingResource;
	{
		vk::VkExtent3D stagingExtent = {(deUint32)width, (deUint32)height, (deUint32)depth};
		ImageCreateInfo stagingResourceCreateInfo(type, m_format, stagingExtent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
												  vk::VK_IMAGE_TILING_LINEAR, vk::VK_IMAGE_USAGE_TRANSFER_DST_BIT);

		stagingResource = Image::createAndAlloc(m_vk, m_device, stagingResourceCreateInfo, allocator,
												vk::MemoryRequirement::HostVisible);

		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		transition2DImage(m_vk, *copyCmdBuffer, stagingResource->object(), aspect, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL);

		const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
		vk::VkImageCopy region = { { (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1}, offset, { (vk::VkImageAspectFlags)aspect, 0, 0, 1}, zeroOffset, {(deUint32)width, (deUint32)height, (deUint32)depth} };

		m_vk.cmdCopyImage(*copyCmdBuffer, object(), layout, stagingResource->object(), vk::VK_IMAGE_LAYOUT_GENERAL, 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}
	return stagingResource;
}